

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * tinyusdz::print_typed_token_timesamples<tinyusdz::GeomMesh::InterpolateBoundary>
                   (string *__return_storage_ptr__,
                   TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary> *v,uint32_t indent)

{
  ulong uVar1;
  size_type sVar2;
  ostream *poVar3;
  const_reference pvVar4;
  uint32_t n;
  InterpolateBoundary v_00;
  string local_260;
  allocator local_239;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  ulong local_1b8;
  size_t i;
  vector<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample>_>
  *samples;
  stringstream ss;
  ostream aoStack_198 [380];
  uint32_t local_1c;
  TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary> *pTStack_18;
  uint32_t indent_local;
  TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary> *v_local;
  
  local_1c = indent;
  pTStack_18 = v;
  v_local = (TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary> *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&samples);
  ::std::operator<<(aoStack_198,"{\n");
  i = (size_t)TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::get_samples(pTStack_18);
  local_1b8 = 0;
  while( true ) {
    uVar1 = local_1b8;
    sVar2 = ::std::
            vector<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample>_>
            ::size((vector<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample>_>
                    *)i);
    if (sVar2 <= uVar1) break;
    pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)(local_1c + 1),n);
    poVar3 = ::std::operator<<(aoStack_198,(string *)&local_1d8);
    pvVar4 = ::std::
             vector<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample>_>
             ::operator[]((vector<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample>_>
                           *)i,local_1b8);
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,pvVar4->t);
    ::std::operator<<(poVar3,": ");
    ::std::__cxx11::string::~string((string *)&local_1d8);
    pvVar4 = ::std::
             vector<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample>_>
             ::operator[]((vector<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample>_>
                           *)i,local_1b8);
    if ((pvVar4->blocked & 1U) == 0) {
      pvVar4 = ::std::
               vector<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample>_>
               ::operator[]((vector<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::InterpolateBoundary>::Sample>_>
                             *)i,local_1b8);
      to_string_abi_cxx11_(&local_218,(tinyusdz *)(ulong)pvVar4->value,v_00);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_238,"\"",&local_239);
      quote(&local_1f8,&local_218,&local_238);
      ::std::operator<<(aoStack_198,(string *)&local_1f8);
      ::std::__cxx11::string::~string((string *)&local_1f8);
      ::std::__cxx11::string::~string((string *)&local_238);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_239);
      ::std::__cxx11::string::~string((string *)&local_218);
    }
    else {
      ::std::operator<<(aoStack_198,"None");
    }
    ::std::operator<<(aoStack_198,",\n");
    local_1b8 = local_1b8 + 1;
  }
  pprint::Indent_abi_cxx11_(&local_260,(pprint *)(ulong)local_1c,n);
  poVar3 = ::std::operator<<(aoStack_198,(string *)&local_260);
  ::std::operator<<(poVar3,"}\n");
  ::std::__cxx11::string::~string((string *)&local_260);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&samples);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_token_timesamples(const TypedTimeSamples<T> &v,
                                          const uint32_t indent = 0) {
  std::stringstream ss;

  ss << "{\n";

  const auto &samples = v.get_samples();

  for (size_t i = 0; i < samples.size(); i++) {
    ss << pprint::Indent(indent + 1) << samples[i].t << ": ";
    if (samples[i].blocked) {
      ss << "None";
    } else {
      ss << quote(to_string(samples[i].value));
    }
    ss << ",\n";
  }

  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}